

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_basics.cpp
# Opt level: O1

void test_3d_static<1ul,1ul,30ul>(void)

{
  long lVar1;
  _Head_base<0UL,_int,_false> *t;
  value_type true_idx;
  tuple<int,_int,_int> dptr [30];
  _Head_base<2UL,_int,_false> local_1bc;
  _Head_base<1UL,_int,_false> local_1b8;
  _Head_base<0UL,_int,_false> local_1b4;
  tuple<int,_int,_int> *local_1b0;
  tuple<int,_int,_int> *local_1a8;
  tuple<int,_int,_int> *local_1a0;
  tuple<int,_int,_int> local_198 [30];
  
  local_198[0].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl._0_1_ = 1;
  local_1b0 = (tuple<int,_int,_int> *)CONCAT71(local_1b0._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xce,"void test_3d_static() [X = 1UL, Y = 1UL, Z = 30UL]",(bool *)local_198,
             (bool *)&local_1b0);
  local_198[0].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
       (_Head_base<2UL,_int,_false>)0x1;
  local_198[0].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = 0;
  local_1b0._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xd0,"void test_3d_static() [X = 1UL, Y = 1UL, Z = 30UL]",(unsigned_long *)local_198,
             (int *)&local_1b0);
  local_198[0].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
       (_Head_base<2UL,_int,_false>)0x1;
  local_198[0].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = 0;
  local_1b0._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xd1,"void test_3d_static() [X = 1UL, Y = 1UL, Z = 30UL]",(unsigned_long *)local_198,
             (int *)&local_1b0);
  local_198[0].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
       (_Head_base<2UL,_int,_false>)0x1;
  local_198[0].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = 0;
  local_1b0 = (tuple<int,_int,_int> *)CONCAT44(local_1b0._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(2))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xd2,"void test_3d_static() [X = 1UL, Y = 1UL, Z = 30UL]",(unsigned_long *)local_198,
             (int *)&local_1b0);
  local_198[0].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
       (_Head_base<2UL,_int,_false>)0x1e;
  local_198[0].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = 0;
  local_1b0 = (tuple<int,_int,_int> *)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y * Z",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xd4,"void test_3d_static() [X = 1UL, Y = 1UL, Z = 30UL]",(unsigned_long *)local_198,
             (unsigned_long *)&local_1b0);
  local_198[0].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
       (_Head_base<2UL,_int,_false>)0x1e;
  local_198[0].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = 0;
  local_1b0 = (tuple<int,_int,_int> *)0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y * Z",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0xd5,"void test_3d_static() [X = 1UL, Y = 1UL, Z = 30UL]",(unsigned_long *)local_198,
             (unsigned_long *)&local_1b0);
  memset(local_198,0,0x168);
  local_1bc._M_head_impl = 0;
  do {
    local_1b8._M_head_impl = 0;
    do {
      local_1b4._M_head_impl = 0;
      do {
        local_1b0 = (tuple<int,_int,_int> *)
                    ((long)local_1bc._M_head_impl + (long)local_1b8._M_head_impl * 0x1e);
        local_1a8 = local_1b0;
        boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                  ("(l.index(i, j, k))","true_idx",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0xe0,"void test_3d_static() [X = 1UL, Y = 1UL, Z = 30UL]",
                   (unsigned_long *)&local_1a8,(unsigned_long *)&local_1b0);
        local_1a8 = local_198 +
                    ((long)local_1b8._M_head_impl + (long)local_1b4._M_head_impl) * 0x1e +
                    (long)local_1bc._M_head_impl;
        local_1a0 = local_198 + (long)local_1b0;
        boost::detail::test_eq_impl<std::tuple<int,int,int>*,std::tuple<int,int,int>*>
                  ("&(dptr[l.index(i, j, k)])","&(dptr[true_idx])",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0xe2,"void test_3d_static() [X = 1UL, Y = 1UL, Z = 30UL]",&local_1a8,&local_1a0)
        ;
        lVar1 = ((long)local_1b8._M_head_impl + (long)local_1b4._M_head_impl) * 0x1e +
                (long)local_1bc._M_head_impl;
        t = &local_198[lVar1].super__Tuple_impl<0UL,_int,_int,_int>.
             super__Head_base<0UL,_int,_false>;
        t->_M_head_impl = local_1b4._M_head_impl;
        local_198[lVar1].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
        super__Head_base<1UL,_int,_false>._M_head_impl = local_1b8._M_head_impl;
        local_198[lVar1].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
        super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false> =
             (_Head_base<2UL,_int,_false>)local_1bc._M_head_impl;
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<0>(dptr[l.index(i, j, k)]))","i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0xe8,"void test_3d_static() [X = 1UL, Y = 1UL, Z = 30UL]",&t->_M_head_impl,
                   &local_1b4._M_head_impl);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<1>(dptr[l.index(i, j, k)]))","j",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0xe9,"void test_3d_static() [X = 1UL, Y = 1UL, Z = 30UL]",
                   &local_198[((long)local_1b8._M_head_impl + (long)local_1b4._M_head_impl) * 0x1e +
                              (long)local_1bc._M_head_impl].super__Tuple_impl<0UL,_int,_int,_int>.
                    super__Tuple_impl<1UL,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl,
                   &local_1b8._M_head_impl);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<2>(dptr[l.index(i, j, k)]))","k",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
                   ,0xea,"void test_3d_static() [X = 1UL, Y = 1UL, Z = 30UL]",
                   (int *)(local_198 +
                          ((long)local_1b8._M_head_impl + (long)local_1b4._M_head_impl) * 0x1e +
                          (long)local_1bc._M_head_impl),&local_1bc._M_head_impl);
        local_1b4._M_head_impl = local_1b4._M_head_impl + 1;
      } while (local_1b4._M_head_impl == 0);
      local_1b8._M_head_impl = local_1b8._M_head_impl + 1;
    } while (local_1b8._M_head_impl == 0);
    local_1bc._M_head_impl = local_1bc._M_head_impl + 1;
  } while ((uint)local_1bc._M_head_impl < 0x1e);
  return;
}

Assistant:

void test_3d_static()
{ // {{{
    layout_mapping_right<
        dimensions<X, Y, Z>, dimensions<1, 1, 1>, dimensions<0, 0, 0>
    >  const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);
    BOOST_TEST_EQ((l.stride(2)), 1);

    BOOST_TEST_EQ((l.size()), X * Y * Z);
    BOOST_TEST_EQ((l.span()), X * Y * Z);

    tuple<int, int, int> dptr[X * Y * Z];

    // Set all elements to a unique value.
    for (auto k = 0; k < l[2]; ++k)
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1]) * (l[2]) * (i) + (l[2]) * (j) + (k);

        BOOST_TEST_EQ((l.index(i, j, k)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j, k)]), &(dptr[true_idx])); 

        std::get<0>(dptr[l.index(i, j, k)]) = i;
        std::get<1>(dptr[l.index(i, j, k)]) = j;
        std::get<2>(dptr[l.index(i, j, k)]) = k;

        BOOST_TEST_EQ((std::get<0>(dptr[l.index(i, j, k)])), i); 
        BOOST_TEST_EQ((std::get<1>(dptr[l.index(i, j, k)])), j); 
        BOOST_TEST_EQ((std::get<2>(dptr[l.index(i, j, k)])), k); 
    }
}